

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_barrier_wait(uv_barrier_t *barrier)

{
  int iVar1;
  
  iVar1 = pthread_barrier_wait((pthread_barrier_t *)barrier);
  if (0xfffffffd < iVar1 - 1U) {
    return (uint)(iVar1 == -1);
  }
  abort();
}

Assistant:

int uv_barrier_wait(uv_barrier_t* barrier) {
  int rc;

  rc = pthread_barrier_wait(barrier);
  if (rc != 0)
    if (rc != PTHREAD_BARRIER_SERIAL_THREAD)
      abort();

  return rc == PTHREAD_BARRIER_SERIAL_THREAD;
}